

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O0

void __thiscall cmInstallTargetGenerator::~cmInstallTargetGenerator(cmInstallTargetGenerator *this)

{
  cmInstallTargetGenerator *this_local;
  
  ~cmInstallTargetGenerator(this);
  operator_delete(this,0x108);
  return;
}

Assistant:

cmInstallTargetGenerator::~cmInstallTargetGenerator()
{
}